

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void set_soonest_timeout(timeval *timeout,periodic_task_handle_conflict task_list,timeval now)

{
  timeval now_00;
  periodic_task_handle_conflict task_list_00;
  long in_RCX;
  long in_RDX;
  timeval *in_RSI;
  long *in_RDI;
  timeval this_delay;
  long local_30;
  
  if (in_RSI != (timeval *)0x0) {
    local_30 = in_RSI[1].tv_sec - in_RDX;
    task_list_00 = (periodic_task_handle_conflict)(in_RSI[1].tv_usec - in_RCX);
    if (in_RSI->tv_usec == -1) {
      if ((long)task_list_00 < 0) {
        local_30 = local_30 + -1;
        task_list_00 = task_list_00 + 0x3d09;
      }
      if (local_30 < 0) {
        task_list_00 = (periodic_task_handle_conflict)0x0;
        local_30 = 0;
      }
      if (((*in_RDI == -1) || (local_30 < *in_RDI)) ||
         ((local_30 == *in_RDI && ((long)task_list_00 < in_RDI[1])))) {
        *in_RDI = local_30;
        in_RDI[1] = (long)task_list_00;
      }
    }
    now_00.tv_usec = in_RDX;
    now_00.tv_sec = (__time_t)in_RDI;
    set_soonest_timeout(in_RSI,task_list_00,now_00);
  }
  return;
}

Assistant:

static void
set_soonest_timeout(struct timeval *timeout, periodic_task_handle task_list, struct timeval now)
{
    struct timeval this_delay;
    if (task_list == NULL) return;
    this_delay.tv_sec = task_list->next_time.tv_sec - now.tv_sec;
    this_delay.tv_usec = task_list->next_time.tv_usec - now.tv_usec;
    if (task_list->executing == (thr_thread_t)-1) {
	/* this task not executing already, see when it needs to run  */
	if (this_delay.tv_usec < 0) {
	    this_delay.tv_sec--;
	    this_delay.tv_usec += 1000000;
	}
	if (this_delay.tv_sec < 0) {
	    this_delay.tv_sec = this_delay.tv_usec = 0;
	}
	if ((timeout->tv_sec == -1) || (timercmp(&this_delay, timeout, <))) {
	    *timeout = this_delay;
	}
    }
    set_soonest_timeout(timeout, task_list->next, now);
}